

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

iuIParamGenerator<std::tuple<bool,_int,_int>_> * __thiscall
iutest::detail::iuConcatParamHolder::operator_cast_to_iuIParamGenerator_(iuConcatParamHolder *this)

{
  iuIParamGenerator<std::tuple<bool,_int,_int>_> *piVar1;
  params_t<std::tuple<bool,_int,_int>_> params;
  vector<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_> local_28;
  
  local_28.
  super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar1 = iuCartesianProductHolder::operator_cast_to_iuIParamGenerator_
                     ((iuCartesianProductHolder *)this);
  iuConcatParamHolder<iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>,_iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>_>
  ::params_t<std::tuple<bool,_int,_int>_>::append
            ((params_t<std::tuple<bool,_int,_int>_> *)&local_28,piVar1);
  piVar1 = iuCartesianProductHolder::operator_cast_to_iuIParamGenerator_
                     ((iuCartesianProductHolder *)(this + 0x20));
  iuConcatParamHolder<iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>,_iutest::detail::iuCartesianProductHolder<iutest::detail::iuValueArray<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>_>
  ::params_t<std::tuple<bool,_int,_int>_>::append
            ((params_t<std::tuple<bool,_int,_int>_> *)&local_28,piVar1);
  piVar1 = (iuIParamGenerator<std::tuple<bool,_int,_int>_> *)operator_new(0x28);
  piVar1->_vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_00399600;
  std::vector<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>::vector
            ((vector<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_> *)
             (piVar1 + 1),&local_28);
  piVar1[4]._vptr_iuIParamGenerator = (_func_int **)0x0;
  if (local_28.
      super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<std::tuple<bool,_int,_int>,_std::allocator<std::tuple<bool,_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return piVar1;
}

Assistant:

operator iuIParamGenerator<T>* ()
    {
        params_t<T> params;
        params.append(m_g1);
        params.append(m_g2);
        return new iuValuesInParamsGenerator<T>(params.val);
    }